

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

void htmlParsePI(htmlParserCtxtPtr ctxt)

{
  xmlChar **ppxVar1;
  int *piVar2;
  uint uVar3;
  xmlParserInputState xVar4;
  xmlParserInputPtr pxVar5;
  processingInstructionSAXFunc p_Var6;
  uint val;
  int iVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int l;
  int local_48;
  int local_44;
  xmlChar *local_40;
  ulong local_38;
  
  if (ctxt->token != 0) {
    return;
  }
  pxVar5 = ctxt->input;
  pxVar8 = pxVar5->cur;
  if (*pxVar8 != '<') {
    return;
  }
  if (pxVar8[1] != '?') {
    return;
  }
  xVar4 = ctxt->instate;
  ctxt->instate = XML_PARSER_PI;
  pxVar8 = pxVar8 + 2;
  pxVar5->cur = pxVar8;
  pxVar5->col = pxVar5->col + 2;
  if ((500 < (long)pxVar8 - (long)pxVar5->base) && ((long)pxVar5->end - (long)pxVar8 < 500)) {
    xmlParserInputShrink(pxVar5);
  }
  pxVar8 = htmlParseName(ctxt);
  if (pxVar8 == (xmlChar *)0x0) {
    htmlParseErr(ctxt,XML_ERR_PI_NOT_STARTED,"PI is not started correctly",(xmlChar *)0x0,
                 (xmlChar *)0x0);
  }
  else {
    if (ctxt->token == 0) {
      pxVar5 = ctxt->input;
      if (*pxVar5->cur == '>') {
        pxVar5->cur = pxVar5->cur + 1;
        pxVar5->col = pxVar5->col + 1;
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var6 = ctxt->sax->processingInstruction, p_Var6 != (processingInstructionSAXFunc)0x0))
        {
          (*p_Var6)(ctxt->userData,pxVar8,(xmlChar *)0x0);
        }
        goto LAB_0014d198;
      }
    }
    pxVar9 = (xmlChar *)(*xmlMallocAtomic)(100);
    if (pxVar9 == (xmlChar *)0x0) {
      htmlErrMemory(ctxt,(char *)0x0);
    }
    else {
      uVar10 = (ulong)*ctxt->input->cur;
      if ((0x20 < uVar10) || ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0)) {
        htmlParseErr(ctxt,XML_ERR_SPACE_REQUIRED,"ParsePI: PI %s space expected\n",pxVar8,
                     (xmlChar *)0x0);
      }
      local_40 = pxVar8;
      htmlSkipBlankChars(ctxt);
      val = htmlCurrentChar(ctxt,&local_44);
      uVar10 = 0;
      iVar12 = 100;
      local_48 = 0;
      while ((val != 0 && (val != 0x3e))) {
        pxVar8 = pxVar9;
        if (iVar12 <= (int)uVar10 + 5) {
          iVar12 = iVar12 * 2;
          local_38 = uVar10;
          pxVar8 = (xmlChar *)(*xmlRealloc)(pxVar9,(long)iVar12);
          uVar10 = local_38;
          if (pxVar8 == (xmlChar *)0x0) {
            htmlErrMemory(ctxt,(char *)0x0);
            (*xmlFree)(pxVar9);
            ctxt->instate = xVar4;
            return;
          }
        }
        if (local_48 < 0x32) {
          local_48 = local_48 + 1;
        }
        else {
          local_48 = 0;
          if ((ctxt->progressive == 0) &&
             (pxVar5 = ctxt->input, local_48 = 0, (long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
            xmlParserInputGrow(pxVar5,0xfa);
            local_48 = 0;
          }
        }
        if ((int)val < 0x100) {
          if ((0x1f < (int)val) ||
             ((iVar11 = local_48, val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
          goto LAB_0014cfe1;
LAB_0014d026:
          htmlParseErrInt(ctxt,0x1f98a4,(char *)(ulong)val,iVar11);
        }
        else {
          uVar3 = val - 0xe000;
          iVar11 = CONCAT31((int3)(uVar3 >> 8),uVar3 < 0x1ffe);
          if ((0xfffff < val - 0x10000 && uVar3 >= 0x1ffe) && 0xd7ff < (int)val) goto LAB_0014d026;
LAB_0014cfe1:
          iVar11 = (int)uVar10;
          if (local_44 == 1) {
            uVar10 = (ulong)(iVar11 + 1);
            pxVar8[iVar11] = (xmlChar)val;
          }
          else {
            iVar7 = xmlCopyChar(local_44,pxVar8 + iVar11,val);
            uVar10 = (ulong)(uint)(iVar7 + iVar11);
          }
        }
        pxVar5 = ctxt->input;
        pxVar9 = pxVar5->cur;
        if (*pxVar9 == '\n') {
          pxVar5->line = pxVar5->line + 1;
          pxVar5->col = 1;
        }
        else {
          pxVar5->col = pxVar5->col + 1;
        }
        ctxt->token = 0;
        pxVar5->cur = pxVar9 + local_44;
        val = htmlCurrentChar(ctxt,&local_44);
        pxVar9 = pxVar8;
        if (val == 0) {
          pxVar5 = ctxt->input;
          if ((500 < (long)pxVar5->cur - (long)pxVar5->base) &&
             ((long)pxVar5->end - (long)pxVar5->cur < 500)) {
            xmlParserInputShrink(pxVar5);
          }
          if ((ctxt->progressive == 0) &&
             (pxVar5 = ctxt->input, (long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
            xmlParserInputGrow(pxVar5,0xfa);
          }
          val = htmlCurrentChar(ctxt,&local_44);
        }
      }
      pxVar9[(int)uVar10] = '\0';
      if (val == 0x3e) {
        pxVar5 = ctxt->input;
        ppxVar1 = &pxVar5->cur;
        *ppxVar1 = *ppxVar1 + 1;
        piVar2 = &pxVar5->col;
        *piVar2 = *piVar2 + 1;
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var6 = ctxt->sax->processingInstruction, p_Var6 != (processingInstructionSAXFunc)0x0))
        {
          (*p_Var6)(ctxt->userData,local_40,pxVar9);
        }
      }
      else {
        htmlParseErr(ctxt,XML_ERR_PI_NOT_FINISHED,"ParsePI: PI %s never end ...\n",local_40,
                     (xmlChar *)0x0);
      }
      (*xmlFree)(pxVar9);
    }
  }
LAB_0014d198:
  ctxt->instate = xVar4;
  return;
}

Assistant:

static void
htmlParsePI(htmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = HTML_PARSER_BUFFER_SIZE;
    int cur, l;
    const xmlChar *target;
    xmlParserInputState state;
    int count = 0;

    if ((RAW == '<') && (NXT(1) == '?')) {
	state = ctxt->instate;
        ctxt->instate = XML_PARSER_PI;
	/*
	 * this is a Processing Instruction.
	 */
	SKIP(2);
	SHRINK;

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = htmlParseName(ctxt);
	if (target != NULL) {
	    if (RAW == '>') {
		SKIP(1);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		ctxt->instate = state;
		return;
	    }
	    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
	    if (buf == NULL) {
		htmlErrMemory(ctxt, NULL);
		ctxt->instate = state;
		return;
	    }
	    cur = CUR;
	    if (!IS_BLANK(cur)) {
		htmlParseErr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target, NULL);
	    }
            SKIP_BLANKS;
	    cur = CUR_CHAR(l);
	    while ((cur != 0) && (cur != '>')) {
		if (len + 5 >= size) {
		    xmlChar *tmp;

		    size *= 2;
		    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
		    if (tmp == NULL) {
			htmlErrMemory(ctxt, NULL);
			xmlFree(buf);
			ctxt->instate = state;
			return;
		    }
		    buf = tmp;
		}
		count++;
		if (count > 50) {
		    GROW;
		    count = 0;
		}
                if (IS_CHAR(cur)) {
		    COPY_BUF(l,buf,len,cur);
                } else {
                    htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                                    "Invalid char in processing instruction "
                                    "0x%X\n", cur);
                }
		NEXTL(l);
		cur = CUR_CHAR(l);
		if (cur == 0) {
		    SHRINK;
		    GROW;
		    cur = CUR_CHAR(l);
		}
	    }
	    buf[len] = 0;
	    if (cur != '>') {
		htmlParseErr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target, NULL);
	    } else {
		SKIP(1);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    htmlParseErr(ctxt, XML_ERR_PI_NOT_STARTED,
                         "PI is not started correctly", NULL, NULL);
	}
	ctxt->instate = state;
    }
}